

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::UnrelatedUploadRenderTimeCase::runSample
          (UnrelatedUploadRenderTimeCase *this,SampleResult *sample)

{
  int iVar1;
  int iVar2;
  DrawMethod DVar3;
  RenderContext *context;
  char cVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  void *__dest;
  deUint64 dVar9;
  deUint64 dVar10;
  Exception *this_00;
  undefined8 *puVar11;
  uint uVar12;
  size_t __n;
  uint uVar13;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexData;
  Surface resultSurface;
  Buffer unrelatedBuffer;
  Buffer indexBuffer;
  Buffer arrayBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  Surface local_c0;
  ObjectWrapper local_a8;
  TextureFormat local_90;
  PixelBufferAccess local_88;
  ObjectWrapper local_60;
  ObjectWrapper local_48;
  long lVar7;
  
  iVar5 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  tcu::Surface::Surface(&local_c0,0x80,0x80);
  iVar5 = (sample->scene).gridWidth;
  iVar1 = (sample->scene).gridHeight;
  iVar2 = (sample->scene).gridLayers;
  iVar6 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar8 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_48,(Functions *)CONCAT44(extraout_var_00,iVar6),pOVar8);
  iVar6 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar8 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_60,(Functions *)CONCAT44(extraout_var_01,iVar6),pOVar8);
  iVar6 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar8 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_a8,(Functions *)CONCAT44(extraout_var_02,iVar6),pOVar8);
  local_f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  generateLayeredGridVertexAttribData4C4V(&local_f8,&sample->scene);
  uVar13 = (int)local_f8.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
           (int)local_f8.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (**(code **)(lVar7 + 0x40))(0x8892,local_48.m_object);
  uVar13 = uVar13 & 0xfffffff0;
  (**(code **)(lVar7 + 0x150))
            (0x8892,(long)(int)uVar13,
             local_f8.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    generateLayeredGridIndexData(&local_d8,&sample->scene);
    (**(code **)(lVar7 + 0x40))(0x8893,local_60.m_object);
    (**(code **)(lVar7 + 0x150))
              (0x8893,(long)((int)local_d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (int)local_d8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffc,
               local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
  }
  RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  iVar5 = iVar5 * iVar1 * iVar2 * 6;
  DVar3 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
          ).m_drawMethod;
  if (DVar3 == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar7 + 0x568))(4,iVar5,0x1405,0);
  }
  else if (DVar3 == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar7 + 0x538))(4,0,iVar5);
  }
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar7 + 0x188))(0x4000);
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  tcu::warmupCPU();
  iVar1 = *(int *)&(this->
                   super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                   ).field_0xcc;
  iVar6 = (int)local_f8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  iVar2 = (int)local_f8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
  if (iVar1 == 2) {
    uVar12 = (int)local_f8.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
             (int)local_f8.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar7 + 0x40))(0x8892,local_a8.m_object);
    uVar12 = uVar12 & 0xfffffff0;
    __n = (size_t)(int)uVar12;
    (**(code **)(lVar7 + 0x150))(0x8892,__n,0,0x88e4);
    __dest = (void *)(**(code **)(lVar7 + 0xd00))(0x8892,0,__n,0x2e);
    if (__dest == (void *)0x0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x30);
      local_88.super_ConstPixelBufferAccess.m_format =
           (TextureFormat)(local_88.super_ConstPixelBufferAccess.m_size.m_data + 2);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"MapBufferRange returned NULL","");
      tcu::Exception::Exception(this_00,(string *)&local_88);
      __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
    }
    memcpy(__dest,local_f8.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,__n);
    cVar4 = (**(code **)(lVar7 + 0x1670))(0x8892);
    if (cVar4 == '\0') {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = &PTR__exception_02195a98;
      __cxa_throw(puVar11,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                  std::exception::~exception);
    }
  }
  else if (iVar1 == 1) {
    uVar12 = (int)local_f8.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
             (int)local_f8.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar7 + 0x40))(0x8892,local_a8.m_object);
    uVar12 = uVar12 & 0xfffffff0;
    (**(code **)(lVar7 + 0x150))(0x8892,(long)(int)uVar12,0,0x88e4);
    (**(code **)(lVar7 + 0x168))
              (0x8892,0,(long)(int)uVar12,
               local_f8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    uVar12 = 0xffffffff;
    if (iVar1 == 0) {
      (**(code **)(lVar7 + 0x40))(0x8892,local_a8.m_object);
      uVar12 = iVar6 - iVar2 & 0xfffffff0;
      (**(code **)(lVar7 + 0x150))
                (0x8892,(long)(int)uVar12,
                 local_f8.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,0x88e4);
    }
  }
  dVar9 = deGetMicroseconds();
  DVar3 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
          ).m_drawMethod;
  if (DVar3 == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar7 + 0x568))(4,iVar5,0x1405,0);
  }
  else if (DVar3 == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar7 + 0x538))(4,0,iVar5);
  }
  dVar10 = deGetMicroseconds();
  (sample->result).duration.renderDuration = dVar10 - dVar9;
  dVar9 = deGetMicroseconds();
  context = ((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx;
  local_90.order = RGBA;
  local_90.type = UNORM_INT8;
  if ((void *)local_c0.m_pixels.m_cap != (void *)0x0) {
    local_c0.m_pixels.m_cap = (size_t)local_c0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_88,&local_90,local_c0.m_width,local_c0.m_height,1,
             (void *)local_c0.m_pixels.m_cap);
  glu::readPixels(context,0,0,&local_88);
  dVar10 = deGetMicroseconds();
  (sample->result).duration.readDuration = dVar10 - dVar9;
  (sample->result).renderDataSize = (sample->result).numVertices << 5;
  (sample->result).uploadedDataSize = uVar13;
  (sample->result).unrelatedDataSize = uVar12;
  dVar9 = (dVar10 - dVar9) + (sample->result).duration.renderDuration;
  (sample->result).duration.renderReadDuration = dVar9;
  (sample->result).duration.totalDuration = dVar9;
  (sample->result).duration.fitResponseDuration = dVar9;
  if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_a8);
  glu::ObjectWrapper::~ObjectWrapper(&local_60);
  glu::ObjectWrapper::~ObjectWrapper(&local_48);
  tcu::Surface::~Surface(&local_c0);
  return;
}

Assistant:

void UnrelatedUploadRenderTimeCase::runSample (SampleResult& sample)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	tcu::Surface			resultSurface		(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	const int				numVertices			= getLayeredGridNumVertices(sample.scene);
	const glu::Buffer		arrayBuffer			(m_context.getRenderContext());
	const glu::Buffer		indexBuffer			(m_context.getRenderContext());
	const glu::Buffer		unrelatedBuffer		(m_context.getRenderContext());
	int						unrelatedUploadSize	= -1;
	int						renderUploadSize;
	std::vector<tcu::Vec4>	vertexData;
	std::vector<deUint32>	indexData;
	deUint64				startTime;
	deUint64				endTime;

	// generate and upload buffers

	generateLayeredGridVertexAttribData4C4V(vertexData, sample.scene);
	renderUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

	gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, renderUploadSize, &vertexData[0], GL_STATIC_DRAW);

	if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
	{
		generateLayeredGridIndexData(indexData, sample.scene);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STATIC_DRAW);
	}

	setupVertexAttribs();

	// make sure data is uploaded

	if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
	else
		DE_ASSERT(false);
	waitGLResults();

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	waitGLResults();

	tcu::warmupCPU();

	// Unrelated upload
	if (m_unrelatedUploadMethod == UPLOADMETHOD_BUFFER_DATA)
	{
		unrelatedUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

		gl.bindBuffer(GL_ARRAY_BUFFER, *unrelatedBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, unrelatedUploadSize, &vertexData[0], GL_STATIC_DRAW);
	}
	else if (m_unrelatedUploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA)
	{
		unrelatedUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

		gl.bindBuffer(GL_ARRAY_BUFFER, *unrelatedBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, unrelatedUploadSize, DE_NULL, GL_STATIC_DRAW);
		gl.bufferSubData(GL_ARRAY_BUFFER, 0, unrelatedUploadSize, &vertexData[0]);
	}
	else if (m_unrelatedUploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE)
	{
		void*			mapPtr;
		glw::GLboolean	unmapSuccessful;

		unrelatedUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

		gl.bindBuffer(GL_ARRAY_BUFFER, *unrelatedBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, unrelatedUploadSize, DE_NULL, GL_STATIC_DRAW);

		mapPtr = gl.mapBufferRange(GL_ARRAY_BUFFER, 0, unrelatedUploadSize, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_RANGE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT | GL_MAP_UNSYNCHRONIZED_BIT);
		if (!mapPtr)
			throw tcu::Exception("MapBufferRange returned NULL");

		deMemcpy(mapPtr, &vertexData[0], unrelatedUploadSize);

		// if unmapping fails, just try again later
		unmapSuccessful = gl.unmapBuffer(GL_ARRAY_BUFFER);
		if (!unmapSuccessful)
			throw UnmapFailureError();
	}
	else
		DE_ASSERT(false);

	DE_ASSERT(unrelatedUploadSize != -1);

	// Measure both draw and associated readpixels
	{
		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.renderDuration = endTime - startTime;
	}

	{
		startTime = deGetMicroseconds();
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
		endTime = deGetMicroseconds();

		sample.result.duration.readDuration = endTime - startTime;
	}

	sample.result.renderDataSize = getVertexDataSize() * sample.result.numVertices;
	sample.result.uploadedDataSize = renderUploadSize;
	sample.result.unrelatedDataSize = unrelatedUploadSize;
	sample.result.duration.renderReadDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.totalDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.fitResponseDuration = sample.result.duration.renderReadDuration;
}